

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void __thiscall XPMP2::Aircraft::SoundRemoveAll(Aircraft *this)

{
  ChnListTy *this_00;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  uint64_t *puVar5;
  ChnListTy *__range1;
  _List_node_base *p_Var6;
  undefined1 auVar7 [16];
  long *local_40 [2];
  long local_30 [2];
  
  if (gpSndSys != (long *)0x0) {
    this_00 = &this->chnList;
    if ((((this->chnList).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          _M_node.super__List_node_base._M_next != (_List_node_base *)this_00) &&
        (DAT_002ef424 == '\x01')) && (glob < 1)) {
      uVar1 = this->modeS_id;
      (*this->_vptr_Aircraft[2])(local_40,this);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x3be,"SoundRemoveAll",logDEBUG,"Aircraft %08X (%s): Removed all sounds",(ulong)uVar1,
             local_40[0]);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    for (p_Var6 = (this_00->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  ._M_node.super__List_node_base._M_next; p_Var6 != (_List_node_base *)this_00;
        p_Var6 = p_Var6->_M_next) {
      (**(code **)(*gpSndSys + 0x28))(gpSndSys,p_Var6[1]._M_next);
    }
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear(this_00);
    auVar3 = _DAT_00249490;
    auVar2 = _DAT_00249480;
    puVar5 = &this->aSndCh[0].chnId;
    lVar4 = 0;
    do {
      auVar7._8_4_ = (int)lVar4;
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7 = (auVar7 | auVar2) ^ auVar3;
      if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffffb) {
        *puVar5 = 0;
        puVar5[3] = 0;
      }
      lVar4 = lVar4 + 2;
      puVar5 = puVar5 + 6;
    } while (lVar4 != 6);
  }
  return;
}

Assistant:

void Aircraft::SoundRemoveAll ()
{
    if (!gpSndSys) return;

    // Log a message only if there actually is anything to stop
    if (!chnList.empty()) {
        LOG_MATCHING(logDEBUG, "Aircraft %08X (%s): Removed all sounds",
                     modeS_id, GetFlightId().c_str());
    }

    // All channels now to be stopped
    for (uint64_t sndId: chnList) gpSndSys->Stop(sndId);
    chnList.clear();
    for (SndChTy &sndChn: aSndCh) sndChn.chnId = 0;
}